

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_NonMaximumSuppression_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00351f90 == '\x01') {
    DAT_00351f90 = '\0';
    (*(code *)*_NonMaximumSuppression_PickTop_default_instance_)();
  }
  if (DAT_00352008 == '\x01') {
    DAT_00352008 = 0;
    (*(code *)*_NonMaximumSuppression_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _NonMaximumSuppression_PickTop_default_instance_.Shutdown();
  _NonMaximumSuppression_default_instance_.Shutdown();
}